

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_api_v2.c
# Opt level: O0

MPP_RET h264e_init(void *ctx,EncImplCfg *ctrl_cfg)

{
  void *pvVar1;
  H264eCtx *p;
  MPP_RET ret;
  EncImplCfg *ctrl_cfg_local;
  void *ctx_local;
  
  mpp_env_get_u32("h264e_debug",&h264e_debug,0);
  if ((h264e_debug & 1) != 0) {
    _mpp_log_l(4,"h264e_api_v2","enter\n","h264e_init");
  }
  *(MppClientType *)ctx = ctrl_cfg->type;
  *(undefined8 *)((long)ctx + 0x1878) = 0x400;
  pvVar1 = mpp_osal_malloc("h264e_init",*(size_t *)((long)ctx + 0x1878));
  *(void **)((long)ctx + 0x1870) = pvVar1;
  if ((*(long *)((long)ctx + 0x1870) == 0) &&
     (_mpp_log_l(2,"h264e_api_v2","Assertion %s failed at %s:%d\n",(char *)0x0,"p->hdr_buf",
                 "h264e_init",0xe0), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  mpp_packet_init((MppPacket *)((long)ctx + 0x1868),*(void **)((long)ctx + 0x1870),
                  *(size_t *)((long)ctx + 0x1878));
  if ((*(long *)((long)ctx + 0x1868) == 0) &&
     (_mpp_log_l(2,"h264e_api_v2","Assertion %s failed at %s:%d\n",(char *)0x0,"p->hdr_pkt",
                 "h264e_init",0xe2), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  *(MppEncCfgSet **)((long)ctx + 8) = ctrl_cfg->cfg;
  *(MppEncRefs *)((long)ctx + 0x10) = ctrl_cfg->refs;
  *(undefined4 *)((long)ctx + 0x18) = 0;
  h264e_reorder_init((H264eReorderInfo *)((long)ctx + 0x1650));
  h264e_marking_init((H264eMarkingInfo *)((long)ctx + 0x175c));
  h264e_dpb_init((H264eDpb *)((long)ctx + 0x1a0),(H264eReorderInfo *)((long)ctx + 0x1650),
                 (H264eMarkingInfo *)((long)ctx + 0x175c));
  h264e_slice_init((H264eSlice *)((long)ctx + 0x15c0),(H264eReorderInfo *)((long)ctx + 0x1650),
                   (H264eMarkingInfo *)((long)ctx + 0x175c));
  init_h264e_cfg_set(*(MppEncCfgSet **)((long)ctx + 8),*ctx);
  mpp_env_get_u32("h264e_debug",&h264e_debug,0);
  if ((h264e_debug & 1) != 0) {
    _mpp_log_l(4,"h264e_api_v2","leave\n","h264e_init");
  }
  return MPP_OK;
}

Assistant:

static MPP_RET h264e_init(void *ctx, EncImplCfg *ctrl_cfg)
{
    MPP_RET ret = MPP_OK;
    H264eCtx *p = (H264eCtx *)ctx;

    mpp_env_get_u32("h264e_debug", &h264e_debug, 0);

    h264e_dbg_func("enter\n");

    p->type = ctrl_cfg->type;
    p->hdr_size = SZ_1K;
    p->hdr_buf = mpp_malloc_size(void, p->hdr_size);
    mpp_assert(p->hdr_buf);
    mpp_packet_init(&p->hdr_pkt, p->hdr_buf, p->hdr_size);
    mpp_assert(p->hdr_pkt);

    p->cfg = ctrl_cfg->cfg;
    p->refs = ctrl_cfg->refs;
    p->idr_request = 0;

    h264e_reorder_init(&p->reorder);
    h264e_marking_init(&p->marking);

    h264e_dpb_init(&p->dpb, &p->reorder, &p->marking);
    h264e_slice_init(&p->slice, &p->reorder, &p->marking);

    init_h264e_cfg_set(p->cfg, p->type);

    mpp_env_get_u32("h264e_debug", &h264e_debug, 0);

    h264e_dbg_func("leave\n");
    return ret;
}